

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid3D.cpp
# Opt level: O0

void __thiscall
TPZGenGrid3D::TPZGenGrid3D
          (TPZGenGrid3D *this,TPZVec<double> *minX,TPZVec<double> *maxX,TPZVec<int> *nelDiv,
          MMeshType meshType)

{
  double dVar1;
  int iVar2;
  int64_t iVar3;
  ostream *poVar4;
  int *piVar5;
  double *pdVar6;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  REAL RVar7;
  size_t in_stack_00000128;
  char *in_stack_00000130;
  REAL tol;
  MMeshType in_stack_fffffffffffffd10;
  TPZVec<double> *in_stack_fffffffffffffd48;
  MMeshType meshType_00;
  TPZManVector<double,_3> *in_stack_fffffffffffffd50;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = in_R8D;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffffd50,
             (TPZVec<int> *)in_stack_fffffffffffffd48);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  meshType_00 = (MMeshType)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  RVar7 = ZeroTolerance();
  iVar3 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 8));
  if (((iVar3 != 3) ||
      (iVar3 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 0xf)), iVar3 != 3)) ||
     (iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 2)), iVar3 != 3)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                            );
    std::operator<<(poVar4," error\n");
    std::operator<<((ostream *)&std::cerr,"minX, maxX and nelDiv must have size = 3!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"size(minX) = ");
    iVar3 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 8));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"size(maxX) = ");
    iVar3 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 0xf));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"size(nelDiv) = ");
    iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 2));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::operator<<(poVar4,"\n");
    pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
  }
  iVar2 = MMeshType_Dimension(in_stack_fffffffffffffd10);
  if (iVar2 == 3) {
    piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 2),0);
    if (((*piVar5 < 1) ||
        (piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 2),1), *piVar5 < 1)) ||
       (piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 2),2), *piVar5 < 1)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                              );
      std::operator<<(poVar4," error\n");
      std::operator<<((ostream *)&std::cerr,
                      "The read number of grid divisions is not allowed. The parameters are:\n");
      poVar4 = std::operator<<((ostream *)&std::cerr,"nel x: ");
      piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 2),0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"nel y: ");
      piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 2),1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"nel z: ");
      piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 2),2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
      std::operator<<(poVar4,"\n");
      pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
    }
    else {
      pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),0);
      if (((*pdVar6 < RVar7) ||
          (pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),1), *pdVar6 < RVar7)
          ) || (pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),2),
               *pdVar6 < RVar7)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                                );
        std::operator<<(poVar4," error\n");
        std::operator<<((ostream *)&std::cerr,
                        "Dimensions of grid not allowed. The parameters are:\n");
        poVar4 = std::operator<<((ostream *)&std::cerr,"max x: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"max y: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"max z: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        std::operator<<(poVar4,"\n");
        pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
      }
      else {
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),0);
        dVar1 = *pdVar6;
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
        if (*pdVar6 <= dVar1) {
          pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),1);
          dVar1 = *pdVar6;
          pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
          if (*pdVar6 <= dVar1) {
            pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),2);
            dVar1 = *pdVar6;
            pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
            if (*pdVar6 <= dVar1) {
              return;
            }
          }
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                                );
        std::operator<<(poVar4," error\n");
        std::operator<<((ostream *)&std::cerr,
                        "Dimensions of grid not allowed. The parameters are:\n");
        poVar4 = std::operator<<((ostream *)&std::cerr,"min x: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"min y: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"min z: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&std::cerr,"max x: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"max y: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"max z: ");
        pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xf),2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
        std::operator<<(poVar4,"\n");
        pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                            );
    std::operator<<(poVar4," error\n");
    std::operator<<((ostream *)&std::cerr,"Element type ");
    poVar4 = ::operator<<((ostream *)in_stack_fffffffffffffd50,meshType_00);
    std::operator<<(poVar4," is not supported. Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
  }
  return;
}

Assistant:

TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &minX, const TPZVec<REAL> &maxX, const TPZVec<int> &nelDiv, const MMeshType meshType)
                           :fGmesh{nullptr}, fMinX{minX}, fMaxX{maxX},fNelDiv{nelDiv},fMeshType{meshType}{
    const REAL tol{ZeroTolerance()};
    if(fMinX.NElements() != 3 || fMaxX.NElements() != 3 || fNelDiv.NElements() != 3){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"minX, maxX and nelDiv must have size = 3!\n";
        PZError<<"size(minX) = "<<fMinX.NElements()<<"\n"
               <<"size(maxX) = "<<fMaxX.NElements()<<"\n"
               <<"size(nelDiv) = "<<fNelDiv.NElements()<<"\n";
        DebugStop();
    }
    if(MMeshType_Dimension(fMeshType) != fDim){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Element type "<<fMeshType<<" is not supported. Aborting...\n";
        DebugStop();
    }
    else if(fNelDiv[0] < 1 || fNelDiv[1] < 1 || fNelDiv[2] < 1){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"The read number of grid divisions is not allowed. The parameters are:\n";
        PZError<<"nel x: "<<fNelDiv[0]<<"\n"<<"nel y: "<<fNelDiv[1]<<"\n"<<"nel z: "<<fNelDiv[2]<<"\n";
        DebugStop();
    }else if(fMaxX[0] < tol || fMaxX[1] < tol || fMaxX[2] < tol){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
    else if(fMaxX[0] < fMinX[0] || fMaxX[1] < fMinX[1] || fMaxX[2] < fMinX[2]){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"min x: "<<fMinX[0]<<"\n"<<"min y: "<<fMinX[1]<<"\n"<<"min z: "<<fMinX[2]<<"\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
}